

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::Decode(LinearSegmentParameter *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  LinearSegmentParameter *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x38) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui8SegNum);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->m_ModificationUnion).m_ui8Modifications);
  pKVar2 = operator>>(pKVar2,(DataTypeBase *)&this->m_ObjApr);
  pKVar2 = operator>>(pKVar2,&(this->m_Loc).super_DataTypeBase);
  pKVar2 = operator>>(pKVar2,&(this->m_Ori).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Length);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Width);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Height);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Depth);
  KDataStream::operator>>(pKVar2,&this->m_ui32Padding);
  return;
}

Assistant:

void LinearSegmentParameter::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < LINEAR_SEGMENT_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8SegNum
           >> m_ModificationUnion.m_ui8Modifications
           >> KDIS_STREAM m_ObjApr
           >> KDIS_STREAM m_Loc
           >> KDIS_STREAM m_Ori
           >> m_ui16Length
           >> m_ui16Width
           >> m_ui16Height
           >> m_ui16Depth
           >> m_ui32Padding;
}